

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_secp256k1.cpp
# Opt level: O3

void __thiscall
Secp256k1_EmptyContextErrorTest_Test::TestBody(Secp256k1_EmptyContextErrorTest_Test *this)

{
  void *pvVar1;
  bool bVar2;
  long lVar3;
  initializer_list<cfd::core::ByteData> __l;
  ByteData actual;
  Secp256k1 secp;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> test_vector;
  allocator_type local_b9;
  string local_b8;
  ByteData local_98;
  ByteData local_80;
  Secp256k1 local_68;
  string local_60;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_40;
  
  cfd::core::Secp256k1::Secp256k1(&local_68,(void *)0x0);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,
             "03662a01c232918c9deb3b330272483c3e4ec0c6b5da86df59252835afeb4ab5f9","");
  cfd::core::ByteData::ByteData(&local_98,&local_b8);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,
             "0261e37f277f02a977b4f11eb5055abab4990bbf8dee701119d88df382fcc1fafe","");
  cfd::core::ByteData::ByteData(&local_80,&local_60);
  __l._M_len = 2;
  __l._M_array = &local_98;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (&local_40,__l,&local_b9);
  lVar3 = 0x30;
  do {
    pvVar1 = *(void **)((long)&local_b8._M_string_length + lVar3);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&local_b8.field_2 + lVar3 + 8) - (long)pvVar1);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::core::Secp256k1::CombinePubkeySecp256k1Ec(&local_98,&local_68,&local_40);
    if ((long *)local_98.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
      operator_delete(local_98.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_98.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  testing::Message::Message((Message *)&local_98);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_secp256k1.cpp"
             ,0x93,
             "Expected: ByteData actual = secp.CombinePubkeySecp256k1Ec(test_vector) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_98);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
  if ((long *)local_98.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       ((long *)local_98.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start != (long *)0x0)) {
      (**(code **)(*(long *)local_98.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_40);
  return;
}

Assistant:

TEST(Secp256k1, EmptyContextErrorTest) {
  struct secp256k1_context_struct *cxt = nullptr;
  Secp256k1 secp = Secp256k1(cxt);

  std::vector<ByteData> test_vector =
      { ByteData(
          "03662a01c232918c9deb3b330272483c3e4ec0c6b5da86df59252835afeb4ab5f9"),
          ByteData(
              "0261e37f277f02a977b4f11eb5055abab4990bbf8dee701119d88df382fcc1fafe") };
  EXPECT_THROW(ByteData actual = secp.CombinePubkeySecp256k1Ec(test_vector),
               CfdException);
}